

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O2

void benchmark(Benchmarks *bench)

{
  bench_t bVar1;
  ulong uVar2;
  
  bVar1 = now();
  uVar2 = bVar1 - bench->single_start;
  if (uVar2 < bench->minimum) {
    bench->minimum = uVar2;
  }
  if (bench->maximum < uVar2) {
    bench->maximum = uVar2;
  }
  bench->sum = bench->sum + uVar2;
  bench->squared_sum = bench->squared_sum + uVar2 * uVar2;
  return;
}

Assistant:

void benchmark(Benchmarks* bench) {
	const bench_t time = now() - bench->single_start;

	if (time < bench->minimum) {
		bench->minimum = time;
	}

	if (time > bench->maximum) {
		bench->maximum = time;
	}

	bench->sum += time;
	bench->squared_sum += (time * time);
}